

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolov3detectionoutput_x86.cpp
# Opt level: O2

int __thiscall
ncnn::Yolov3DetectionOutput_x86::forward
          (Yolov3DetectionOutput_x86 *this,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  undefined4 uVar1;
  undefined8 uVar2;
  pointer pMVar3;
  void *pvVar4;
  uint uVar5;
  undefined1 auVar6 [12];
  int iVar7;
  float *pfVar8;
  float *pfVar9;
  _func_int *p_Var10;
  undefined4 *puVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  float *pfVar17;
  float *pfVar18;
  Mat *pMVar19;
  ulong uVar20;
  long lVar21;
  long lVar22;
  int iVar23;
  float *pfVar24;
  int i;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar32;
  float extraout_XMM0_Db;
  float extraout_XMM0_Db_00;
  undefined1 auVar31 [16];
  float fVar33;
  float fVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  float fVar40;
  float fVar41;
  long local_218;
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  bbox_rects;
  float *local_1c0;
  vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
  all_box_bbox_rects;
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  all_bbox_rects;
  int local_178;
  vector<unsigned_long,_std::allocator<unsigned_long>_> picked;
  int local_98;
  float fStack_50;
  float fStack_4c;
  
  all_bbox_rects.
  super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  all_bbox_rects.
  super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  all_bbox_rects.
  super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar20 = 0;
  do {
    if ((ulong)(((long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                       _M_impl.super__Vector_impl_data._M_finish -
                (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                      _M_impl.super__Vector_impl_data._M_start) / 0x48) <= uVar20) {
      Yolov3DetectionOutput::qsort_descent_inplace
                ((Yolov3DetectionOutput *)
                 ((long)&this->_vptr_Yolov3DetectionOutput_x86 +
                 (long)this->_vptr_Yolov3DetectionOutput_x86[-3]),&all_bbox_rects);
      picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      Yolov3DetectionOutput::nms_sorted_bboxes
                ((Yolov3DetectionOutput *)
                 ((long)&this->_vptr_Yolov3DetectionOutput_x86 +
                 (long)this->_vptr_Yolov3DetectionOutput_x86[-3]),&all_bbox_rects,&picked,
                 *(float *)(&this->field_0xdc + (long)this->_vptr_Yolov3DetectionOutput_x86[-3]));
      bbox_rects.
      super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
      ._M_impl.super__Vector_impl_data._M_start._0_4_ = 0.0;
      bbox_rects.
      super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
      ._M_impl.super__Vector_impl_data._M_start._4_4_ = 0.0;
      bbox_rects.
      super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
      ._M_impl.super__Vector_impl_data._M_finish._0_4_ = 0.0;
      bbox_rects.
      super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
      ._M_impl.super__Vector_impl_data._M_finish._4_4_ = 0.0;
      bbox_rects.
      super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0.0;
      bbox_rects.
      super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0.0;
      for (uVar20 = 0;
          uVar20 < (ulong)((long)picked.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                           (long)picked.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_start >> 3); uVar20 = uVar20 + 1
          ) {
        std::
        vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
        ::push_back(&bbox_rects,
                    all_bbox_rects.
                    super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                    ._M_impl.super__Vector_impl_data._M_start +
                    picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                    .super__Vector_impl_data._M_start[uVar20]);
      }
      uVar20 = (CONCAT44(bbox_rects.
                         super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                         ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                         bbox_rects.
                         super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                         ._M_impl.super__Vector_impl_data._M_finish._0_4_) -
               CONCAT44(bbox_rects.
                        super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                        ._M_impl.super__Vector_impl_data._M_start._4_4_,
                        bbox_rects.
                        super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                        ._M_impl.super__Vector_impl_data._M_start._0_4_)) / 0x1c;
      iVar23 = (int)uVar20;
      if (iVar23 == 0) {
        iVar7 = 0;
      }
      else {
        pMVar19 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        Mat::create(pMVar19,6,iVar23,4,opt->blob_allocator);
        pvVar4 = pMVar19->data;
        iVar7 = -100;
        if ((pvVar4 != (void *)0x0) && ((long)pMVar19->c * pMVar19->cstep != 0)) {
          puVar11 = (undefined4 *)
                    CONCAT44(bbox_rects.
                             super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                             ._M_impl.super__Vector_impl_data._M_start._4_4_,
                             bbox_rects.
                             super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                             ._M_impl.super__Vector_impl_data._M_start._0_4_);
          iVar7 = 0;
          uVar20 = uVar20 & 0xffffffff;
          if (iVar23 < 1) {
            uVar20 = 0;
          }
          for (uVar16 = 0; uVar20 != uVar16; uVar16 = uVar16 + 1) {
            uVar1 = *puVar11;
            lVar21 = (long)pMVar19->w * uVar16 * pMVar19->elemsize;
            *(float *)((long)pvVar4 + lVar21) = (float)(puVar11[6] + 1);
            *(undefined4 *)((long)pvVar4 + lVar21 + 4) = uVar1;
            *(undefined4 *)((long)pvVar4 + lVar21 + 8) = puVar11[1];
            *(undefined4 *)((long)pvVar4 + lVar21 + 0xc) = puVar11[2];
            *(undefined4 *)((long)pvVar4 + lVar21 + 0x10) = puVar11[3];
            *(undefined4 *)((long)pvVar4 + lVar21 + 0x14) = puVar11[4];
            puVar11 = puVar11 + 7;
          }
        }
      }
      std::
      _Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
      ::~_Vector_base(&bbox_rects.
                       super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                     );
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                (&picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
LAB_0027fffa:
      std::
      _Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
      ::~_Vector_base(&all_bbox_rects.
                       super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                     );
      return iVar7;
    }
    all_box_bbox_rects.
    super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    all_box_bbox_rects.
    super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    all_box_bbox_rects.
    super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    std::
    vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
    ::resize(&all_box_bbox_rects,
             (long)*(int *)(&this->field_0xd4 + (long)this->_vptr_Yolov3DetectionOutput_x86[-3]));
    pMVar3 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    p_Var10 = this->_vptr_Yolov3DetectionOutput_x86[-3];
    iVar23 = *(int *)(&this->field_0xd4 + (long)p_Var10);
    iVar7 = pMVar3[uVar20].c / iVar23;
    if (iVar7 != *(int *)(&this->field_0xd0 + (long)p_Var10) + 5) {
      std::
      vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
      ::~vector(&all_box_bbox_rects);
      iVar7 = -1;
      goto LAB_0027fffa;
    }
    pMVar19 = pMVar3 + uVar20;
    lVar21 = (long)iVar23;
    uVar16._0_4_ = pMVar19->w;
    uVar16._4_4_ = pMVar19->h;
    auVar35._0_4_ = (float)(int)(undefined4)uVar16;
    auVar35._4_4_ = (float)(int)uVar16._4_4_;
    fVar34 = *(float *)(*(long *)(&this->field_0x170 + (long)p_Var10) + uVar20 * 4);
    fVar33 = (float)(int)(fVar34 * auVar35._0_4_);
    fVar34 = (float)(int)(fVar34 * auVar35._4_4_);
    uVar12 = 0;
    if (0 < (int)(undefined4)uVar16) {
      uVar12 = uVar16 & 0xffffffff;
    }
    auVar31._4_4_ = uVar16._4_4_;
    auVar31._0_4_ = uVar16._4_4_;
    auVar31._8_4_ = uVar16._4_4_;
    auVar31._12_4_ = uVar16._4_4_;
    uVar5 = uVar16._4_4_;
    if ((int)uVar16._4_4_ < 1) {
      uVar5 = 0;
    }
    auVar35._8_8_ = 0x3f0000003f000000;
    auVar31 = rcpps(auVar31,auVar35);
    fVar25 = auVar31._0_4_;
    fVar32 = auVar31._4_4_;
    for (lVar13 = 0; lVar13 < iVar23; lVar13 = lVar13 + 1) {
      iVar23 = (int)lVar13 * iVar7;
      uVar2 = *(undefined8 *)
               (*(long *)(&this->field_0xe0 + (long)p_Var10) +
               (long)((int)*(float *)(*(long *)(&this->field_0x128 + (long)p_Var10) +
                                      lVar21 * uVar20 * 4 + lVar13 * 4) * 2) * 4);
      Mat::channel((Mat *)&picked,pMVar19,iVar23);
      pfVar8 = (float *)picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start;
      Mat::~Mat((Mat *)&picked);
      Mat::channel((Mat *)&picked,pMVar19,iVar23 + 1);
      pfVar17 = (float *)picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_start;
      Mat::~Mat((Mat *)&picked);
      Mat::channel((Mat *)&picked,pMVar19,iVar23 + 2);
      pfVar18 = (float *)picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_start;
      Mat::~Mat((Mat *)&picked);
      Mat::channel((Mat *)&picked,pMVar19,iVar23 + 3);
      local_1c0 = (float *)picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                           _M_impl.super__Vector_impl_data._M_start;
      Mat::~Mat((Mat *)&picked);
      Mat::channel((Mat *)&picked,pMVar19,iVar23 + 4);
      pfVar24 = (float *)picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_start;
      Mat::~Mat((Mat *)&picked);
      Mat::channel_range((Mat *)&picked,pMVar19,iVar23 + 5,
                         *(int *)(&this->field_0xd0 +
                                 (long)this->_vptr_Yolov3DetectionOutput_x86[-3]));
      local_218 = 0;
      for (uVar15 = 0; uVar15 != uVar5; uVar15 = uVar15 + 1) {
        lVar22 = local_218;
        for (uVar14 = 0; uVar14 != uVar12; uVar14 = uVar14 + 1) {
          p_Var10 = this->_vptr_Yolov3DetectionOutput_x86[-3];
          fVar27 = -3.4028235e+38;
          for (pfVar9 = (float *)((long)picked.
                                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                        ._M_impl.super__Vector_impl_data._M_start + lVar22);
              pfVar9 < (float *)((long)picked.
                                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                       ._M_impl.super__Vector_impl_data._M_start +
                                (long)*(int *)(&this->field_0xd0 + (long)p_Var10) * (long)local_98 *
                                4 + uVar14 * 4 + uVar15 * (long)(int)(undefined4)uVar16 * 4);
              pfVar9 = pfVar9 + local_98) {
            if (fVar27 <= *pfVar9) {
              fVar27 = *pfVar9;
            }
          }
          fVar26 = expf(-*pfVar24);
          fVar27 = expf(-fVar27);
          fVar27 = 1.0 / ((fVar27 + 1.0) * fVar26 + 1.0);
          if (*(float *)(&this->field_0xd8 + (long)p_Var10) <= fVar27) {
            fVar26 = *pfVar17;
            auVar31 = ZEXT416((uint)fVar26);
            fVar28 = expf(-*pfVar8);
            fVar26 = expf(-fVar26);
            fVar29 = expf(*pfVar18);
            fVar30 = expf(*local_1c0);
            auVar39._4_4_ = fVar26 + 1.0;
            auVar39._0_4_ = fVar28 + 1.0;
            auVar39._8_4_ = extraout_XMM0_Db + 0.0;
            auVar39._12_4_ = extraout_XMM0_Db_00 + 0.0;
            auVar31 = rcpps(auVar31,auVar39);
            fStack_50 = (float)uVar2;
            fStack_4c = (float)((ulong)uVar2 >> 0x20);
            auVar38._0_4_ = auVar31._0_4_ * 1.0;
            auVar38._4_4_ = auVar31._4_4_ * 1.0;
            auVar38._8_4_ = fStack_50 * auVar31._8_4_;
            auVar38._12_4_ = fStack_4c * auVar31._12_4_;
            auVar6._4_8_ = auVar31._8_8_;
            auVar6._0_4_ = (float)(int)uVar15;
            auVar36._0_8_ = auVar6._0_8_ << 0x20;
            auVar36._8_4_ = fVar33;
            auVar36._12_4_ = fVar34;
            local_178 = (int)uVar14;
            auVar37._4_12_ = auVar36._4_12_;
            auVar37._0_4_ = (float)local_178;
            auVar39 = rcpps(auVar38,auVar37);
            fVar40 = fVar29 * fStack_50 * auVar39._8_4_;
            fVar41 = fVar30 * fStack_4c * auVar39._12_4_;
            fVar40 = (fVar29 * fStack_50 - fVar33 * fVar40) * auVar39._8_4_ + fVar40;
            fVar41 = (fVar30 * fStack_4c - fVar34 * fVar41) * auVar39._12_4_ + fVar41;
            fVar28 = ((1.0 - (fVar28 + 1.0) * auVar38._0_4_) * auVar31._0_4_ + auVar38._0_4_ +
                     auVar37._0_4_) * ((1.0 - auVar35._0_4_ * fVar25) * fVar25 + fVar25);
            fVar26 = ((1.0 - (fVar26 + 1.0) * auVar38._4_4_) * auVar31._4_4_ + auVar38._4_4_ +
                     (float)(int)uVar15) * ((1.0 - auVar35._4_4_ * fVar32) * fVar32 + fVar32);
            fVar29 = fVar40 * 0.5;
            fVar30 = fVar41 * 0.5;
            bbox_rects.
            super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
            ._M_impl.super__Vector_impl_data._M_start._4_4_ = fVar28 - fVar29;
            bbox_rects.
            super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
            ._M_impl.super__Vector_impl_data._M_finish._0_4_ = fVar26 - fVar30;
            bbox_rects.
            super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
            ._M_impl.super__Vector_impl_data._M_finish._4_4_ = fVar28 + fVar29;
            bbox_rects.
            super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = fVar26 + fVar30;
            bbox_rects.
            super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = fVar40 * fVar41;
            bbox_rects.
            super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
            ._M_impl.super__Vector_impl_data._M_start._0_4_ = fVar27;
            std::
            vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
            ::push_back(all_box_bbox_rects.
                        super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + lVar13,(value_type *)&bbox_rects
                       );
          }
          pfVar8 = pfVar8 + 1;
          pfVar17 = pfVar17 + 1;
          pfVar18 = pfVar18 + 1;
          local_1c0 = local_1c0 + 1;
          pfVar24 = pfVar24 + 1;
          lVar22 = lVar22 + 4;
        }
        local_218 = local_218 + (long)(int)(undefined4)uVar16 * 4;
      }
      Mat::~Mat((Mat *)&picked);
      p_Var10 = this->_vptr_Yolov3DetectionOutput_x86[-3];
      iVar23 = *(int *)(&this->field_0xd4 + (long)p_Var10);
    }
    lVar21 = 8;
    for (lVar13 = 0; lVar13 < *(int *)(&this->field_0xd4 + (long)p_Var10); lVar13 = lVar13 + 1) {
      std::
      vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>
      ::
      insert<__gnu_cxx::__normal_iterator<ncnn::Yolov3DetectionOutput::BBoxRect_const*,std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>>,void>
                ((vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>
                  *)&all_bbox_rects,
                 (const_iterator)
                 all_bbox_rects.
                 super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                 ._M_impl.super__Vector_impl_data._M_finish,
                 *(BBoxRect **)
                  ((long)all_box_bbox_rects.
                         super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar21 + -8),
                 *(BBoxRect **)
                  ((long)&((all_box_bbox_rects.
                            super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                          )._M_impl.super__Vector_impl_data._M_start + lVar21));
      p_Var10 = this->_vptr_Yolov3DetectionOutput_x86[-3];
      lVar21 = lVar21 + 0x18;
    }
    std::
    vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
    ::~vector(&all_box_bbox_rects);
    uVar20 = uVar20 + 1;
  } while( true );
}

Assistant:

int Yolov3DetectionOutput_x86::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    // gather all box
    std::vector<BBoxRect> all_bbox_rects;

    for (size_t b = 0; b < bottom_blobs.size(); b++)
    {
        std::vector<std::vector<BBoxRect> > all_box_bbox_rects;
        all_box_bbox_rects.resize(num_box);
        const Mat& bottom_top_blobs = bottom_blobs[b];

        int w = bottom_top_blobs.w;
        int h = bottom_top_blobs.h;
        int channels = bottom_top_blobs.c;
        //printf("%d %d %d\n", w, h, channels);
        const int channels_per_box = channels / num_box;

        // anchor coord + box score + num_class
        if (channels_per_box != 4 + 1 + num_class)
            return -1;
        size_t mask_offset = b * num_box;
        int net_w = (int)(anchors_scale[b] * w);
        int net_h = (int)(anchors_scale[b] * h);
//printf("%d %d\n", net_w, net_h);

//printf("%d %d %d\n", w, h, channels);
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int pp = 0; pp < num_box; pp++)
        {
            int p = pp * channels_per_box;
            int biases_index = static_cast<int>(mask[pp + mask_offset]);
            //printf("%d\n", biases_index);
            const float bias_w = biases[biases_index * 2];
            const float bias_h = biases[biases_index * 2 + 1];
            //printf("%f %f\n", bias_w, bias_h);
            const float* xptr = bottom_top_blobs.channel(p);
            const float* yptr = bottom_top_blobs.channel(p + 1);
            const float* wptr = bottom_top_blobs.channel(p + 2);
            const float* hptr = bottom_top_blobs.channel(p + 3);

            const float* box_score_ptr = bottom_top_blobs.channel(p + 4);

            // softmax class scores
            Mat scores = bottom_top_blobs.channel_range(p + 5, num_class);
            //softmax->forward_inplace(scores, opt);

            const int cs = scores.cstep;

#if __AVX__
            const __m256i vi = _mm256_setr_epi32(
                                   0, cs * 1, cs * 2, cs * 3, cs * 4, cs * 5, cs * 6, cs * 7);
#endif

            for (int i = 0; i < h; i++)
            {
                for (int j = 0; j < w; j++)
                {
#if 0
                    int class_index = 0;
                    float class_score = -FLT_MAX;
                    for (int q = 0; q < num_class; q++)
                    {
                        float score = scores.channel(q).row(i)[j];
                        if (score > class_score)
                        {
                            class_index = q;
                            class_score = score;
                        }
                    }
#else
                    // find class index with max class score
                    int class_index = 0;
                    float class_score = -FLT_MAX;
                    float* ptr = ((float*)scores.data) + i * w + j;
                    float* end = ptr + num_class * cs;
                    int q = 0;
#if __AVX2__
                    float* end8 = ptr + (num_class & -8) * cs;
                    unsigned long index;

                    for (; ptr < end8; ptr += 8 * cs, q += 8)
                    {
                        __m256 p = _mm256_i32gather_ps(ptr, vi, 4);
                        __m256 t = _mm256_max_ps(p, _mm256_permute2f128_ps(p, p, 1));
                        t = _mm256_max_ps(t, _mm256_permute_ps(t, 0x4e));
                        t = _mm256_max_ps(t, _mm256_permute_ps(t, 0xb1));
                        float score = _mm_cvtss_f32(_mm256_extractf128_ps(t, 0));

                        if (score > class_score)
                        {
                            __m256 mi = _mm256_cmp_ps(p, t, _CMP_EQ_OQ);
                            int mask = _mm256_movemask_ps(mi);
#ifdef _MSC_VER
                            BitScanForward(&index, mask);
#else
                            index = __builtin_ctz(mask);
#endif
                            class_index = q + index;
                            class_score = score;
                        }
                    }
#endif

                    for (; ptr < end; ptr += cs, q++)
                    {
                        if (*ptr > class_score)
                        {
                            class_index = q;
                            class_score = *ptr;
                        }
                    }
#endif
                    //sigmoid(box_score) * sigmoid(class_score)
                    float confidence = 1.f / ((1.f + exp(-box_score_ptr[0]) * (1.f + exp(-class_score))));
                    if (confidence >= confidence_threshold)
                    {
                        // region box
                        float bbox_cx = (j + sigmoid(xptr[0])) / w;
                        float bbox_cy = (i + sigmoid(yptr[0])) / h;
                        float bbox_w = static_cast<float>(exp(wptr[0]) * bias_w / net_w);
                        float bbox_h = static_cast<float>(exp(hptr[0]) * bias_h / net_h);

                        float bbox_xmin = bbox_cx - bbox_w * 0.5f;
                        float bbox_ymin = bbox_cy - bbox_h * 0.5f;
                        float bbox_xmax = bbox_cx + bbox_w * 0.5f;
                        float bbox_ymax = bbox_cy + bbox_h * 0.5f;

                        float area = bbox_w * bbox_h;

                        BBoxRect c = {confidence, bbox_xmin, bbox_ymin, bbox_xmax, bbox_ymax, area, class_index};
                        all_box_bbox_rects[pp].push_back(c);
                    }

                    xptr++;
                    yptr++;
                    wptr++;
                    hptr++;

                    box_score_ptr++;
                }
            }
        }

        for (int i = 0; i < num_box; i++)
        {
            const std::vector<BBoxRect>& box_bbox_rects = all_box_bbox_rects[i];

            all_bbox_rects.insert(all_bbox_rects.end(), box_bbox_rects.begin(), box_bbox_rects.end());
        }
    }

    // global sort inplace
    qsort_descent_inplace(all_bbox_rects);

    // apply nms
    std::vector<size_t> picked;
    nms_sorted_bboxes(all_bbox_rects, picked, nms_threshold);

    // select
    std::vector<BBoxRect> bbox_rects;

    for (size_t i = 0; i < picked.size(); i++)
    {
        size_t z = picked[i];
        bbox_rects.push_back(all_bbox_rects[z]);
    }

    // fill result
    int num_detected = static_cast<int>(bbox_rects.size());
    if (num_detected == 0)
        return 0;

    Mat& top_blob = top_blobs[0];
    top_blob.create(6, num_detected, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    for (int i = 0; i < num_detected; i++)
    {
        const BBoxRect& r = bbox_rects[i];
        float score = r.score;
        float* outptr = top_blob.row(i);

        outptr[0] = static_cast<float>(r.label + 1); // +1 for prepend background class
        outptr[1] = score;
        outptr[2] = r.xmin;
        outptr[3] = r.ymin;
        outptr[4] = r.xmax;
        outptr[5] = r.ymax;
    }

    return 0;
}